

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

void __thiscall
QStringMatcher::QStringMatcher(QStringMatcher *this,QString *pattern,CaseSensitivity cs)

{
  long lVar1;
  undefined4 in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringMatcher *in_stack_ffffffffffffff98;
  QStringView *local_48;
  qsizetype local_18;
  Data *pDStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  *(undefined4 *)&(in_RDI->d).ptr = in_EDX;
  QString::QString((QString *)&(in_RDI->d).size,(QString *)in_stack_ffffffffffffff98);
  QStringView::QStringView((QStringView *)&in_RDI[1].d.size);
  local_48 = (QStringView *)&in_RDI[2].d.ptr;
  do {
    *(undefined1 *)&local_48->m_size = 0;
    local_48 = (QStringView *)((long)&local_48->m_size + 1);
  } while (local_48 != (QStringView *)(in_RDI + 0xd));
  QStringView::QStringView<QString,_true>((QStringView *)(in_RDI + 0xd),in_RDI);
  in_RDI[1].d.size = local_18;
  in_RDI[2].d.d = pDStack_10;
  updateSkipTable(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QStringMatcher::QStringMatcher(const QString &pattern, Qt::CaseSensitivity cs)
    : d_ptr(nullptr), q_cs(cs), q_pattern(pattern)
{
    q_sv = q_pattern;
    updateSkipTable();
}